

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlRelaxNGGrammarPtr_conflict pxVar3;
  bool bVar4;
  int iVar5;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlRelaxNGDefinePtr pxVar10;
  xmlRelaxNGGrammarPtr_conflict pxVar11;
  xmlHashTablePtr pxVar12;
  void *pvVar13;
  xmlRelaxNGDefinePtr *ppxVar14;
  xmlRelaxNGDefinePtr_conflict pxVar15;
  uint uVar16;
  char *pcVar17;
  xmlNodePtr pxVar18;
  _xmlNode *p_Var19;
  xmlChar *str2;
  xmlNodePtr node_00;
  xmlRelaxNGDefinePtr_conflict pxVar20;
  xmlRelaxNGDefinePtr_conflict local_50;
  xmlRelaxNGDefinePtr local_38;
  
  if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
      (iVar5 = xmlStrEqual(node->name,"element"), iVar5 != 0)) &&
     (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
     iVar5 != 0)) {
    pxVar6 = xmlRelaxNGParseElement(ctxt,node);
    return pxVar6;
  }
  if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
     ((iVar5 = xmlStrEqual(node->name,"attribute"), iVar5 == 0 ||
      (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
      iVar5 == 0)))) {
    if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
       ((iVar5 = xmlStrEqual(node->name,"empty"), iVar5 != 0 &&
        (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
        iVar5 != 0)))) {
      pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
      if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar6->type = XML_RELAXNG_EMPTY;
      if (node->children == (_xmlNode *)0x0) {
        return pxVar6;
      }
      pcVar17 = "empty: had a child node\n";
      iVar5 = 0x401;
      goto LAB_00187215;
    }
    if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
        (iVar5 = xmlStrEqual(node->name,"text"), iVar5 != 0)) &&
       (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
       iVar5 != 0)) {
      pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
      if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar6->type = XML_RELAXNG_TEXT;
      if (node->children == (_xmlNode *)0x0) {
        return pxVar6;
      }
      pcVar17 = "text: had a child node\n";
      iVar5 = 0x455;
      goto LAB_00187215;
    }
    if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
       ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"zeroOrMore"), iVar5 == 0 ||
        (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
        iVar5 == 0)))) {
      if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
         ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"oneOrMore"), iVar5 != 0 &&
          (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
          iVar5 != 0)))) {
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_ONEORMORE;
        goto LAB_00186855;
      }
      if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
          (iVar5 = xmlStrEqual(node->name,(xmlChar *)"optional"), iVar5 != 0)) &&
         (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar5 != 0)) {
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_OPTIONAL;
        goto LAB_00186855;
      }
      if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
         ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"choice"), iVar5 != 0 &&
          (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
          iVar5 != 0)))) {
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_CHOICE;
LAB_00186cdf:
        p_Var19 = node->children;
        if (p_Var19 != (_xmlNode *)0x0) {
          iVar5 = 0;
          goto LAB_00186cf1;
        }
        goto LAB_0018702e;
      }
      if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
         ((iVar5 = xmlStrEqual(node->name,"group"), iVar5 != 0 &&
          (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
          iVar5 != 0)))) {
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_GROUP;
        goto LAB_00186cdf;
      }
      if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
          (iVar5 = xmlStrEqual(node->name,"ref"), iVar5 != 0)) &&
         (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
         iVar5 != 0)) {
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_REF;
        pxVar8 = xmlGetProp(node,"name");
        pxVar6->name = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          pcVar17 = "ref has no name\n";
          iVar5 = 0x44e;
          pxVar8 = (xmlChar *)0x0;
LAB_0018708f:
          xmlRngPErr(ctxt,node,iVar5,pcVar17,pxVar8,(xmlChar *)0x0);
        }
        else {
          xmlRelaxNGNormExtSpace(pxVar8);
          iVar5 = xmlValidateNCName(pxVar6->name,0);
          if (iVar5 != 0) {
            pxVar8 = pxVar6->name;
            pcVar17 = "ref name \'%s\' is not an NCName\n";
            iVar5 = 0x44c;
            goto LAB_0018708f;
          }
        }
        if (node->children != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x44f,"ref is not empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        if (ctxt->grammar->refs == (xmlHashTablePtr)0x0) {
          pxVar12 = xmlHashCreate(10);
          ctxt->grammar->refs = pxVar12;
        }
        pxVar12 = ctxt->grammar->refs;
        if (pxVar12 == (xmlHashTablePtr)0x0) {
          pcVar17 = "Could not create references hash\n";
        }
        else {
          iVar5 = xmlHashAddEntry(pxVar12,pxVar6->name,pxVar6);
          if (-1 < iVar5) {
            return pxVar6;
          }
          pvVar13 = xmlHashLookup(ctxt->grammar->refs,pxVar6->name);
          if (pvVar13 != (void *)0x0) {
LAB_00187113:
            pxVar6->nextHash = *(xmlRelaxNGDefinePtr *)((long)pvVar13 + 0x58);
            *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar13 + 0x58) = pxVar6;
            return pxVar6;
          }
          pxVar8 = pxVar6->name;
          if (pxVar8 != (xmlChar *)0x0) {
            pcVar17 = "Error refs definitions \'%s\'\n";
            pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
            iVar5 = 0x44a;
            goto LAB_00187218;
          }
          pcVar17 = "Error refs definitions\n";
        }
        pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
        iVar5 = 0x44a;
        goto LAB_00187215;
      }
      if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
         ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"data"), iVar5 == 0 ||
          (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
          iVar5 == 0)))) {
        if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
           ((iVar5 = xmlStrEqual(node->name,"value"), iVar5 != 0 &&
            (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar5 != 0)))) {
          pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
          if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          pxVar6->type = XML_RELAXNG_VALUE;
          pxVar8 = xmlGetProp(node,"type");
          if (pxVar8 == (xmlChar *)0x0) {
            pvVar13 = (void *)0x0;
LAB_001871e2:
            bVar4 = false;
          }
          else {
            xmlRelaxNGNormExtSpace(pxVar8);
            pxVar18 = (xmlNodePtr)0x0;
            iVar5 = xmlValidateNCName(pxVar8,0);
            if (iVar5 != 0) {
              pxVar18 = node;
              xmlRngPErr(ctxt,node,0x458,"value type \'%s\' is not an NCName\n",pxVar8,
                         (xmlChar *)0x0);
            }
            pxVar9 = xmlRelaxNGGetDataTypeLibrary((xmlRelaxNGParserCtxtPtr)node,pxVar18);
            if (pxVar9 == (xmlChar *)0x0) {
              pxVar9 = xmlStrdup((xmlChar *)"http://relaxng.org/ns/structure/1.0");
            }
            pxVar6->name = pxVar8;
            pxVar6->ns = pxVar9;
            pvVar13 = xmlHashLookup(xmlRelaxNGRegisteredTypes,pxVar9);
            if (pvVar13 == (void *)0x0) {
              pvVar13 = (void *)0x0;
              xmlRngPErr(ctxt,node,0x45c,"Use of unregistered type library \'%s\'\n",pxVar9,
                         (xmlChar *)0x0);
              pxVar6->data = (void *)0x0;
              goto LAB_001871e2;
            }
            pxVar6->data = pvVar13;
            if (*(code **)((long)pvVar13 + 0x10) == (code *)0x0) {
              bVar4 = false;
              xmlRngPErr(ctxt,node,0x402,"Internal error with type library \'%s\': no \'have\'\n",
                         pxVar9,(xmlChar *)0x0);
            }
            else {
              iVar5 = (**(code **)((long)pvVar13 + 0x10))
                                (*(undefined8 *)((long)pvVar13 + 8),pxVar6->name);
              bVar4 = true;
              if (iVar5 != 1) {
                xmlRngPErr(ctxt,node,0x457,
                           "Error type \'%s\' is not exported by type library \'%s\'\n",pxVar6->name
                           ,pxVar9);
                goto LAB_001871e2;
              }
            }
          }
          p_Var19 = node->children;
          if (p_Var19 == (_xmlNode *)0x0) {
            pxVar8 = xmlStrdup("");
            pxVar6->value = pxVar8;
            return pxVar6;
          }
          if ((p_Var19->type - XML_TEXT_NODE < 2) && (p_Var19->next == (_xmlNode *)0x0)) {
            pxVar8 = xmlNodeGetContent(node);
            pxVar6->value = pxVar8;
            if (pxVar8 != (xmlChar *)0x0) {
              if (pvVar13 == (void *)0x0) {
                return pxVar6;
              }
              if (!bVar4 || *(code **)((long)pvVar13 + 0x18) == (code *)0x0) {
                return pxVar6;
              }
              local_38 = (xmlRelaxNGDefinePtr)0x0;
              iVar5 = (**(code **)((long)pvVar13 + 0x18))
                                (*(undefined8 *)((long)pvVar13 + 8),pxVar6->name,pxVar8,&local_38,
                                 node);
              if (iVar5 == 1) {
                if (local_38 != (xmlRelaxNGDefinePtr)0x0) {
                  pxVar6->attrs = local_38;
                  return pxVar6;
                }
                return pxVar6;
              }
              pxVar9 = pxVar6->name;
              pxVar8 = pxVar6->value;
              pcVar17 = "Value \'%s\' is not acceptable for type \'%s\'\n";
              iVar5 = 0x41b;
              goto LAB_0018721b;
            }
            pcVar17 = "Element <value> has no content\n";
            iVar5 = 0x460;
          }
          else {
            pcVar17 = "Expecting a single text value for <value>content\n";
            iVar5 = 0x454;
          }
          goto LAB_00187215;
        }
        if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
            (iVar5 = xmlStrEqual(node->name,"list"), iVar5 != 0)) &&
           (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
           iVar5 != 0)) {
          pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
          if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          pxVar6->type = XML_RELAXNG_LIST;
          goto LAB_00186cdf;
        }
        if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
           ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"interleave"), iVar5 != 0 &&
            (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar5 != 0)))) {
          pxVar6 = xmlRelaxNGParseInterleave(ctxt,node);
          return pxVar6;
        }
        if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
           ((iVar5 = xmlStrEqual(node->name,(xmlChar *)"externalRef"), iVar5 != 0 &&
            (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar5 != 0)))) {
          pxVar6 = xmlRelaxNGProcessExternalRef(ctxt,node);
          return pxVar6;
        }
        if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
            (iVar5 = xmlStrEqual(node->name,(xmlChar *)"notAllowed"), iVar5 != 0)) &&
           (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
           iVar5 != 0)) {
          pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
          if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          pxVar6->type = XML_RELAXNG_NOT_ALLOWED;
          if (node->children == (_xmlNode *)0x0) {
            return pxVar6;
          }
          pcVar17 = "xmlRelaxNGParse: notAllowed element is not empty\n";
          iVar5 = 0x41f;
          goto LAB_00187215;
        }
        if (((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
           ((iVar5 = xmlStrEqual(node->name,"grammar"), iVar5 != 0 &&
            (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar5 != 0)))) {
          pxVar2 = ctxt->grammar;
          pxVar3 = ctxt->parentgrammar;
          ctxt->parentgrammar = pxVar2;
          pxVar11 = xmlRelaxNGParseGrammar(ctxt,node->children);
          if (pxVar2 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
            ctxt->grammar = pxVar2;
            ctxt->parentgrammar = pxVar3;
          }
          if (pxVar11 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
            return (xmlRelaxNGDefinePtr_conflict)0x0;
          }
          return pxVar11->start;
        }
        if (((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) ||
           ((iVar5 = xmlStrEqual(node->name,"parentRef"), iVar5 == 0 ||
            (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
            iVar5 == 0)))) {
          if ((((node->ns != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) &&
              (iVar5 = xmlStrEqual(node->name,(xmlChar *)"mixed"), iVar5 != 0)) &&
             (iVar5 = xmlStrEqual(node->ns->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"),
             iVar5 != 0)) {
            if (node->children != (_xmlNode *)0x0) {
              pxVar6 = xmlRelaxNGParseInterleave(ctxt,node);
              if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              if (((pxVar6->content != (xmlRelaxNGDefinePtr)0x0) &&
                  (pxVar6->content->next != (xmlRelaxNGDefinePtr)0x0)) &&
                 (pxVar7 = xmlRelaxNGNewDefine(ctxt,node),
                 pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                pxVar7->type = XML_RELAXNG_GROUP;
                pxVar7->content = pxVar6->content;
                pxVar6->content = pxVar7;
              }
              pxVar10 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar10 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return pxVar6;
              }
              pxVar10->type = XML_RELAXNG_TEXT;
              pxVar10->next = pxVar6->content;
              goto LAB_00186cf6;
            }
            pcVar17 = "Mixed is empty\n";
            pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
            iVar5 = 0x3ff;
            goto LAB_00187215;
          }
          pxVar8 = node->name;
          pcVar17 = "Unexpected node %s is not a pattern\n";
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
          iVar5 = 0x45b;
          goto LAB_00187218;
        }
        if (ctxt->parentgrammar == (xmlRelaxNGGrammarPtr_conflict)0x0) {
          pcVar17 = "Use of parentRef without a parent grammar\n";
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
          iVar5 = 0x427;
          goto LAB_00187215;
        }
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_PARENTREF;
        pxVar8 = xmlGetProp(node,"name");
        pxVar6->name = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          pcVar17 = "parentRef has no name\n";
          iVar5 = 0x426;
          pxVar8 = (xmlChar *)0x0;
LAB_0018752f:
          xmlRngPErr(ctxt,node,iVar5,pcVar17,pxVar8,(xmlChar *)0x0);
        }
        else {
          xmlRelaxNGNormExtSpace(pxVar8);
          iVar5 = xmlValidateNCName(pxVar6->name,0);
          if (iVar5 != 0) {
            pxVar8 = pxVar6->name;
            pcVar17 = "parentRef name \'%s\' is not an NCName\n";
            iVar5 = 0x425;
            goto LAB_0018752f;
          }
        }
        if (node->children != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x428,"parentRef is not empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        if (ctxt->parentgrammar->refs == (xmlHashTablePtr)0x0) {
          pxVar12 = xmlHashCreate(10);
          ctxt->parentgrammar->refs = pxVar12;
        }
        pxVar12 = ctxt->parentgrammar->refs;
        if (pxVar12 == (xmlHashTablePtr)0x0) {
          pcVar17 = "Could not create references hash\n";
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
          iVar5 = 0x424;
          goto LAB_00187215;
        }
        if (pxVar6->name == (xmlChar *)0x0) {
          return pxVar6;
        }
        iVar5 = xmlHashAddEntry(pxVar12,pxVar6->name,pxVar6);
        if (-1 < iVar5) {
          return pxVar6;
        }
        pvVar13 = xmlHashLookup(ctxt->parentgrammar->refs,pxVar6->name);
        if (pvVar13 != (void *)0x0) goto LAB_00187113;
        pxVar8 = pxVar6->name;
        pcVar17 = "Internal error parentRef definitions \'%s\'\n";
        pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
        iVar5 = 0x424;
      }
      else {
        pxVar8 = xmlGetProp(node,"type");
        if (pxVar8 == (xmlChar *)0x0) {
          pcVar17 = "data has no type\n";
          pxVar6 = (xmlRelaxNGDefinePtr_conflict)0x0;
          iVar5 = 0x456;
          goto LAB_00187215;
        }
        xmlRelaxNGNormExtSpace(pxVar8);
        pxVar18 = (xmlNodePtr)0x0;
        iVar5 = xmlValidateNCName(pxVar8,0);
        if (iVar5 != 0) {
          pxVar18 = node;
          xmlRngPErr(ctxt,node,0x458,"data type \'%s\' is not an NCName\n",pxVar8,(xmlChar *)0x0);
        }
        pxVar9 = xmlRelaxNGGetDataTypeLibrary((xmlRelaxNGParserCtxtPtr)node,pxVar18);
        if (pxVar9 == (xmlChar *)0x0) {
          pxVar9 = xmlStrdup((xmlChar *)"http://relaxng.org/ns/structure/1.0");
        }
        pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
          (*xmlFree)(pxVar9);
          (*xmlFree)(pxVar8);
          return (xmlRelaxNGDefinePtr_conflict)0x0;
        }
        pxVar6->type = XML_RELAXNG_DATATYPE;
        pxVar6->name = pxVar8;
        pxVar6->ns = pxVar9;
        pvVar13 = xmlHashLookup(xmlRelaxNGRegisteredTypes,pxVar9);
        if (pvVar13 == (void *)0x0) {
          xmlRngPErr(ctxt,node,0x45c,"Use of unregistered type library \'%s\'\n",pxVar9,
                     (xmlChar *)0x0);
          pxVar6->data = (void *)0x0;
        }
        else {
          pxVar6->data = pvVar13;
          if (*(code **)((long)pvVar13 + 0x10) == (code *)0x0) {
            pcVar17 = "Internal error with type library \'%s\': no \'have\'\n";
            iVar5 = 0x402;
            str2 = (xmlChar *)0x0;
            pxVar8 = pxVar9;
          }
          else {
            iVar5 = (**(code **)((long)pvVar13 + 0x10))
                              (*(undefined8 *)((long)pvVar13 + 8),pxVar6->name);
            if (iVar5 == 1) {
              iVar5 = xmlStrEqual(pxVar9,(xmlChar *)"http://www.w3.org/2001/XMLSchema-datatypes");
              if ((iVar5 != 0) &&
                 ((iVar5 = xmlStrEqual(pxVar6->name,"IDREF"), iVar5 != 0 ||
                  (iVar5 = xmlStrEqual(pxVar6->name,"IDREFS"), iVar5 != 0)))) {
                ctxt->idref = 1;
              }
              goto LAB_001872c5;
            }
            pcVar17 = "Error type \'%s\' is not exported by type library \'%s\'\n";
            iVar5 = 0x457;
            pxVar8 = pxVar6->name;
            str2 = pxVar9;
          }
          xmlRngPErr(ctxt,node,iVar5,pcVar17,pxVar8,str2);
        }
LAB_001872c5:
        pxVar18 = node->children;
        if (pxVar18 != (_xmlNode *)0x0) {
          local_50 = (xmlRelaxNGDefinePtr_conflict)0x0;
          do {
            iVar5 = xmlStrEqual(pxVar18->name,(xmlChar *)"param");
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(pxVar18->name,(xmlChar *)"except");
              if (iVar5 != 0) {
                pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                  pxVar7->type = XML_RELAXNG_EXCEPT;
                  node_00 = pxVar18->children;
                  pxVar6->content = pxVar7;
                  if (node_00 == (xmlNodePtr)0x0) {
                    xmlRngPErr(ctxt,pxVar18,0x406,"except has no content\n",(xmlChar *)0x0,
                               (xmlChar *)0x0);
                  }
                  else {
                    pxVar20 = (xmlRelaxNGDefinePtr_conflict)0x0;
                    do {
                      pxVar15 = xmlRelaxNGParsePattern(ctxt,node_00);
                      if (pxVar15 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                        ppxVar14 = &pxVar20->next;
                        if (pxVar20 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                          ppxVar14 = &pxVar7->content;
                        }
                        *ppxVar14 = pxVar15;
                        pxVar20 = pxVar15;
                      }
                      node_00 = node_00->next;
                    } while (node_00 != (_xmlNode *)0x0);
                  }
                  pxVar18 = pxVar18->next;
                }
                if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                  return pxVar6;
                }
              }
              goto LAB_001873e0;
            }
            iVar5 = xmlStrEqual(pxVar9,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
            if (iVar5 == 0) {
              pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                pxVar7->type = XML_RELAXNG_PARAM;
                pxVar8 = xmlGetProp(pxVar18,"name");
                pxVar7->name = pxVar8;
                if (pxVar8 == (xmlChar *)0x0) {
                  xmlRngPErr(ctxt,node,0x423,"param has no name\n",(xmlChar *)0x0,(xmlChar *)0x0);
                }
                pxVar8 = xmlNodeGetContent(pxVar18);
                pxVar7->value = pxVar8;
                ppxVar14 = &local_50->next;
                if (local_50 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                  ppxVar14 = &pxVar6->attrs;
                }
                *ppxVar14 = pxVar7;
                local_50 = pxVar7;
              }
              pxVar18 = pxVar18->next;
            }
            else {
              xmlRngPErr(ctxt,node,0x422,"Type library \'%s\' does not allow type parameters\n",
                         pxVar9,(xmlChar *)0x0);
              do {
                pxVar18 = pxVar18->next;
                if (pxVar18 == (_xmlNode *)0x0) {
                  pxVar18 = (_xmlNode *)0x0;
                  break;
                }
                iVar5 = xmlStrEqual(pxVar18->name,(xmlChar *)"param");
              } while (iVar5 != 0);
            }
          } while (pxVar18 != (_xmlNode *)0x0);
        }
        pxVar18 = (xmlNodePtr)0x0;
LAB_001873e0:
        node = pxVar18;
        if (node == (xmlNodePtr)0x0) {
          return pxVar6;
        }
        pxVar8 = node->name;
        pcVar17 = "Element data has unexpected content %s\n";
        iVar5 = 0x3f1;
      }
    }
    else {
      pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
      if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar6->type = XML_RELAXNG_ZEROORMORE;
LAB_00186855:
      p_Var19 = node->children;
      if (p_Var19 != (_xmlNode *)0x0) {
        iVar5 = 1;
LAB_00186cf1:
        pxVar10 = xmlRelaxNGParsePatterns(ctxt,p_Var19,iVar5);
LAB_00186cf6:
        pxVar6->content = pxVar10;
        return pxVar6;
      }
LAB_0018702e:
      pxVar8 = node->name;
      pcVar17 = "Element %s is empty\n";
      iVar5 = 0x3ff;
    }
  }
  else {
    pxVar6 = xmlRelaxNGNewDefine(ctxt,node);
    if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    pxVar6->type = XML_RELAXNG_ATTRIBUTE;
    pxVar6->parent = ctxt->def;
    pxVar18 = node->children;
    if (pxVar18 != (xmlNodePtr)0x0) {
      uVar1 = ctxt->flags;
      ctxt->flags = uVar1 | 1;
      pxVar7 = xmlRelaxNGParseNameClass(ctxt,pxVar18,pxVar6);
      if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
        pxVar18 = pxVar18->next;
      }
      if (pxVar18 != (xmlNodePtr)0x0) {
        pxVar7 = xmlRelaxNGParsePattern(ctxt,pxVar18);
        if ((pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           (uVar16 = pxVar7->type + XML_RELAXNG_NOT_ALLOWED, uVar16 < 0x16)) {
          if ((0x1fff76U >> (uVar16 & 0x1f) & 1) == 0) {
            if ((0x200088U >> (uVar16 & 0x1f) & 1) == 0) {
              pcVar17 = "RNG Internal error, noop found in attribute\n";
              iVar5 = 0x3ed;
            }
            else {
              pcVar17 = "attribute has invalid content\n";
              iVar5 = 0x3eb;
            }
            xmlRngPErr(ctxt,node,iVar5,pcVar17,(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            pxVar6->content = pxVar7;
            pxVar7->parent = pxVar6;
          }
        }
        if (pxVar18->next != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x3ea,"attribute has multiple children\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        }
      }
      ctxt->flags = uVar1;
      return pxVar6;
    }
    pcVar17 = "xmlRelaxNGParseattribute: attribute has no children\n";
    iVar5 = 0x3ec;
LAB_00187215:
    pxVar8 = (xmlChar *)0x0;
  }
LAB_00187218:
  pxVar9 = (xmlChar *)0x0;
LAB_0018721b:
  xmlRngPErr(ctxt,node,iVar5,pcVar17,pxVar8,pxVar9);
  return pxVar6;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;

    if (node == NULL) {
        return (NULL);
    }
    if (IS_RELAXNG(node, "element")) {
        def = xmlRelaxNGParseElement(ctxt, node);
    } else if (IS_RELAXNG(node, "attribute")) {
        def = xmlRelaxNGParseAttribute(ctxt, node);
    } else if (IS_RELAXNG(node, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EMPTY;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_NOT_EMPTY,
                       "empty: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "text")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_TEXT;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_TEXT_HAS_CHILD,
                       "text: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "zeroOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ZEROORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "oneOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ONEORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "optional")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_OPTIONAL;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "choice")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_CHOICE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "group")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_GROUP;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "ref")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_REF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NO_NAME, "ref has no name\n",
                       NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_REF_NAME_INVALID,
                           "ref name '%s' is not an NCName\n", def->name,
                           NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NOT_EMPTY, "ref is not empty\n",
                       NULL, NULL);
        }
        if (ctxt->grammar->refs == NULL)
            ctxt->grammar->refs = xmlHashCreate(10);
        if (ctxt->grammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else {
            int tmp;

            tmp = xmlHashAddEntry(ctxt->grammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->grammar->refs, def->name);
                if (prev == NULL) {
                    if (def->name != NULL) {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions '%s'\n",
				   def->name, NULL);
                    } else {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions\n",
				   NULL, NULL);
                    }
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "data")) {
        def = xmlRelaxNGParseData(ctxt, node);
    } else if (IS_RELAXNG(node, "value")) {
        def = xmlRelaxNGParseValue(ctxt, node);
    } else if (IS_RELAXNG(node, "list")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_LIST;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "interleave")) {
        def = xmlRelaxNGParseInterleave(ctxt, node);
    } else if (IS_RELAXNG(node, "externalRef")) {
        def = xmlRelaxNGProcessExternalRef(ctxt, node);
    } else if (IS_RELAXNG(node, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "xmlRelaxNGParse: notAllowed element is not empty\n",
                       NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "grammar")) {
        xmlRelaxNGGrammarPtr grammar, old;
        xmlRelaxNGGrammarPtr oldparent;

        oldparent = ctxt->parentgrammar;
        old = ctxt->grammar;
        ctxt->parentgrammar = old;
        grammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (old != NULL) {
            ctxt->grammar = old;
            ctxt->parentgrammar = oldparent;
#if 0
            if (grammar != NULL) {
                grammar->next = old->next;
                old->next = grammar;
            }
#endif
        }
        if (grammar != NULL)
            def = grammar->start;
        else
            def = NULL;
    } else if (IS_RELAXNG(node, "parentRef")) {
        if (ctxt->parentgrammar == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_PARENT,
                       "Use of parentRef without a parent grammar\n", NULL,
                       NULL);
            return (NULL);
        }
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_PARENTREF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_NAME,
                       "parentRef has no name\n", NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NAME_INVALID,
                           "parentRef name '%s' is not an NCName\n",
                           def->name, NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NOT_EMPTY,
                       "parentRef is not empty\n", NULL, NULL);
        }
        if (ctxt->parentgrammar->refs == NULL)
            ctxt->parentgrammar->refs = xmlHashCreate(10);
        if (ctxt->parentgrammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else if (def->name != NULL) {
            int tmp;

            tmp =
                xmlHashAddEntry(ctxt->parentgrammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->parentgrammar->refs, def->name);
                if (prev == NULL) {
                    xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                               "Internal error parentRef definitions '%s'\n",
                               def->name, NULL);
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "mixed")) {
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT, "Mixed is empty\n",
                       NULL, NULL);
            def = NULL;
        } else {
            def = xmlRelaxNGParseInterleave(ctxt, node);
            if (def != NULL) {
                xmlRelaxNGDefinePtr tmp;

                if ((def->content != NULL) && (def->content->next != NULL)) {
                    tmp = xmlRelaxNGNewDefine(ctxt, node);
                    if (tmp != NULL) {
                        tmp->type = XML_RELAXNG_GROUP;
                        tmp->content = def->content;
                        def->content = tmp;
                    }
                }

                tmp = xmlRelaxNGNewDefine(ctxt, node);
                if (tmp == NULL)
                    return (def);
                tmp->type = XML_RELAXNG_TEXT;
                tmp->next = def->content;
                def->content = tmp;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_UNKNOWN_CONSTRUCT,
                   "Unexpected node %s is not a pattern\n", node->name,
                   NULL);
        def = NULL;
    }
    return (def);
}